

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

int decode_utf16(CPUS390XState_conflict *env,uint64_t addr,uint64_t ilen,_Bool enh_check,
                uintptr_t ra,uint32_t *ochar,uint32_t *olen)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint value;
  uint32_t uVar4;
  
  if (ilen < 2) {
    return 0;
  }
  uVar1 = cpu_lduw_data_ra_s390x(env,addr,ra);
  value = uVar1 & 0xffff;
  if ((uVar1 & 0xfc00) == 0xd800) {
    if (ilen < 4) {
      return 0;
    }
    uVar2 = cpu_lduw_data_ra_s390x(env,addr + 2,ra);
    uVar4 = 4;
    uVar3 = extract32(value,6,4);
    if (enh_check && (uVar2 & 0xfc00) != 0xdc00) {
      return 2;
    }
    value = (uVar2 & 0x3ff) + ((uVar1 & 0x3f) << 10 | uVar3 << 0x10) + 0x10000;
  }
  else {
    uVar4 = 2;
  }
  *ochar = value;
  *olen = uVar4;
  return -1;
}

Assistant:

static int decode_utf16(CPUS390XState *env, uint64_t addr, uint64_t ilen,
                        bool enh_check, uintptr_t ra,
                        uint32_t *ochar, uint32_t *olen)
{
    uint16_t s0, s1;
    uint32_t c, l;

    if (ilen < 2) {
        return 0;
    }
    s0 = cpu_lduw_data_ra(env, addr, ra);
    if ((s0 & 0xfc00) != 0xd800) {
        /* one word character */
        l = 2;
        c = s0;
    } else {
        /* two word character */
        l = 4;
        if (ilen < 4) {
            return 0;
        }
        s1 = cpu_lduw_data_ra(env, addr + 2, ra);
        c = extract32(s0, 6, 4) + 1;
        c = (c << 6) | (s0 & 0x3f);
        c = (c << 10) | (s1 & 0x3ff);
        if (enh_check && (s1 & 0xfc00) != 0xdc00) {
            /* invalid surrogate character */
            return 2;
        }
    }

    *ochar = c;
    *olen = l;
    return -1;
}